

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

string * __thiscall
kratos::Var::handle_name_abi_cxx11_(string *__return_storage_ptr__,Var *this,bool ignore_top)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  undefined8 local_a8 [2];
  long *local_98;
  undefined8 uStack_90;
  undefined1 local_88 [8];
  string gen_name;
  long local_58;
  long *local_48;
  undefined8 uStack_40;
  long local_38 [2];
  
  iVar1 = (*(this->super_IRNode)._vptr_IRNode[0xd])(this);
  Generator::handle_name_abi_cxx11_
            ((string *)local_88,(Generator *)CONCAT44(extraout_var,iVar1),ignore_top);
  if (gen_name._M_dataplus._M_p == (pointer)0x0) {
    (*(this->super_IRNode)._vptr_IRNode[0x1f])(__return_storage_ptr__,this);
  }
  else {
    iVar1 = (*(this->super_IRNode)._vptr_IRNode[0xd])(this);
    Generator::handle_name_abi_cxx11_
              ((string *)((long)&gen_name.field_2 + 8),(Generator *)CONCAT44(extraout_var_00,iVar1),
               ignore_top);
    (*(this->super_IRNode)._vptr_IRNode[0x1f])(&local_48,this);
    local_a8[0] = gen_name.field_2._8_8_;
    local_98 = local_48;
    uStack_90 = uStack_40;
    format_str.size_ = 0xdd;
    format_str.data_ = (char *)0x7;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_a8;
    fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)0x24cb6d,format_str,args);
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    if ((long *)gen_name.field_2._8_8_ != &stack0xffffffffffffffa8) {
      operator_delete((void *)gen_name.field_2._8_8_,local_58 + 1);
    }
  }
  if (local_88 != (undefined1  [8])&gen_name._M_string_length) {
    operator_delete((void *)local_88,gen_name._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Var::handle_name(bool ignore_top) const {
    auto gen_name = generator()->handle_name(ignore_top);
    if (!gen_name.empty())
        return ::format("{0}.{1}", generator()->handle_name(ignore_top), to_string());
    else
        return to_string();
}